

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<char>::ReallocForNuma(TPZVec<char> *this)

{
  ulong __n;
  char *__src;
  char *__dest;
  
  __n = this->fNElements;
  if ((__n != 0) && (__src = this->fStore, __src != (char *)0x0)) {
    __dest = (char *)operator_new__(__n);
    memcpy(__dest,__src,__n);
    operator_delete__(__src);
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}